

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandShortNames(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      Abc_NtkShortNames(pNtk_00);
      pAbc_local._4_4_ = 0;
    }
  }
  else {
    Abc_Print(-2,"usage: short_names [-h]\n");
    Abc_Print(-2,"\t         replaces PI/PO/latch names by short char strings\n");
    Abc_Print(-2,"\t-h     : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandShortNames( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    Abc_NtkShortNames( pNtk );
    return 0;

usage:
    Abc_Print( -2, "usage: short_names [-h]\n" );
    Abc_Print( -2, "\t         replaces PI/PO/latch names by short char strings\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}